

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

void opt_j(opt_state_t *opt_state,edge *ep)

{
  int iVar1;
  int iVar2;
  int iVar3;
  block *pbVar4;
  uset pbVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  bpf_u_int32 bVar9;
  block *pbVar10;
  int iVar11;
  
  pbVar10 = ep->succ;
  pbVar4 = (pbVar10->et).succ;
  if (pbVar4 != (block *)0x0) {
    if (pbVar4 == (pbVar10->ef).succ) {
      if (pbVar4->out_use != 0) {
        lVar8 = 0;
        do {
          if (((pbVar4->out_use >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
             (ep->pred->val[lVar8] != pbVar4->val[lVar8])) goto LAB_00115157;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x12);
      }
      opt_state->done = 0;
      ep->succ = pbVar4;
      pbVar10 = pbVar4;
    }
LAB_00115157:
    iVar1 = opt_state->edgewords;
    if (0 < (long)iVar1) {
      pbVar5 = ep->edom;
LAB_0011516d:
      lVar8 = 0;
      do {
        bVar9 = pbVar5[lVar8];
        if (bVar9 != 0) {
          iVar2 = (pbVar10->s).code;
          do {
            uVar6 = 0;
            if (bVar9 != 0) {
              for (; (bVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            iVar3 = opt_state->edges[(int)(uVar6 | (int)lVar8 << 5)]->code;
            iVar11 = -iVar3;
            if (0 < iVar3) {
              iVar11 = iVar3;
            }
            if ((iVar2 == iVar11) &&
               (pbVar4 = opt_state->edges[(int)(uVar6 | (int)lVar8 << 5)]->pred,
               pbVar10->val[0x10] == pbVar4->val[0x10])) {
              if (pbVar10->oval == pbVar4->oval) {
                lVar7 = 0x80;
                if (-1 < iVar3) {
                  lVar7 = 0x58;
                }
              }
              else if ((iVar3 < 0) || (lVar7 = 0x80, iVar2 != 0x15)) goto LAB_00115239;
              pbVar4 = *(block **)((long)&pbVar10->id + lVar7);
              if (pbVar4 != (block *)0x0) {
                if (pbVar4->out_use == 0) {
LAB_00115256:
                  opt_state->done = 0;
                  ep->succ = pbVar4;
                  pbVar10 = pbVar4;
                  if ((pbVar4->et).succ == (block *)0x0) {
                    return;
                  }
                  goto LAB_0011516d;
                }
                lVar7 = 0;
                while (((pbVar4->out_use >> ((uint)lVar7 & 0x1f) & 1) == 0 ||
                       (ep->pred->val[lVar7] == pbVar4->val[lVar7]))) {
                  lVar7 = lVar7 + 1;
                  if (lVar7 == 0x12) goto LAB_00115256;
                }
              }
            }
LAB_00115239:
            bVar9 = bVar9 & ~(1 << (uVar6 & 0x1f));
          } while (bVar9 != 0);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  return;
}

Assistant:

static void
opt_j(opt_state_t *opt_state, struct edge *ep)
{
	register int i, k;
	register struct block *target;

	if (JT(ep->succ) == 0)
		return;

	if (JT(ep->succ) == JF(ep->succ)) {
		/*
		 * Common branch targets can be eliminated, provided
		 * there is no data dependency.
		 */
		if (!use_conflict(ep->pred, ep->succ->et.succ)) {
			opt_state->done = 0;
			ep->succ = JT(ep->succ);
		}
	}
	/*
	 * For each edge dominator that matches the successor of this
	 * edge, promote the edge successor to the its grandchild.
	 *
	 * XXX We violate the set abstraction here in favor a reasonably
	 * efficient loop.
	 */
 top:
	for (i = 0; i < opt_state->edgewords; ++i) {
		register bpf_u_int32 x = ep->edom[i];

		while (x != 0) {
			k = ffs(x) - 1;
			x &=~ (1 << k);
			k += i * BITS_PER_WORD;

			target = fold_edge(ep->succ, opt_state->edges[k]);
			/*
			 * Check that there is no data dependency between
			 * nodes that will be violated if we move the edge.
			 */
			if (target != 0 && !use_conflict(ep->pred, target)) {
				opt_state->done = 0;
				ep->succ = target;
				if (JT(target) != 0)
					/*
					 * Start over unless we hit a leaf.
					 */
					goto top;
				return;
			}
		}
	}
}